

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

bool mxx::impl::
     is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *begin,long end,comm *param_3)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = std::
          is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    ();
  if (param_3->m_size == 1) {
    return bVar2;
  }
  iVar3 = right_shift<int>((int *)(end + -4),param_3);
  bVar1 = param_3->m_rank < 1;
  if (bVar2 && !bVar1) {
    bVar2 = iVar3 <= *begin;
  }
  else {
    bVar2 = bVar2 && bVar1;
  }
  bVar2 = all_of(bVar2,param_3);
  return bVar2;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // check that it is locally sorted (int for MPI_Reduction)
    bool sorted = std::is_sorted(begin, end, comp);

    // if single process, this is it
    if (comm.size() == 1)
        return sorted;

    // compare if last element on left processor is not bigger than first
    // element on mine
    value_type left_el = mxx::right_shift(*(end-1), comm);

    // check if sorted with respect to neighbors
    if (comm.rank() > 0) {
        sorted = sorted && !comp(*begin, left_el);
    }

    // now check that this condition is true for all processes
    return mxx::all_of(sorted, comm);
}